

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionGenericTypeTS_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,EnumDef *union_enum)

{
  bool bVar1;
  char *__rhs;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"any",&local_39);
  bVar1 = UnionHasStringType(this,union_enum);
  __rhs = "";
  if (bVar1) {
    __rhs = "|string";
  }
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnionGenericTypeTS(const EnumDef &union_enum) {
    // TODO: make it work without any
    // return std::string("T") + (UnionHasStringType(union_enum) ? "|string" :
    // "");
    return std::string("any") +
           (UnionHasStringType(union_enum) ? "|string" : "");
  }